

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O2

size_t apduCmdDec(apdu_cmd_t *cmd,octet *apdu,size_t count)

{
  ushort uVar1;
  ulong count_00;
  size_t sVar2;
  byte *src;
  ulong uVar3;
  ulong uStack_40;
  
  sVar2 = 0xffffffffffffffff;
  if (count < 4) {
    return 0xffffffffffffffff;
  }
  if (cmd != (apdu_cmd_t *)0x0) {
    memSet(cmd,'\0',0x18);
    cmd->cla = *apdu;
    cmd->ins = apdu[1];
    cmd->p1 = apdu[2];
    cmd->p2 = apdu[3];
  }
  src = apdu + 4;
  uVar3 = count - 4;
  if (uVar3 < 2) {
LAB_0011738a:
    count_00 = 0;
    uStack_40 = 0;
  }
  else {
    count_00 = (ulong)*src;
    if (uVar3 == 3) {
      if (count_00 == 0) {
        uStack_40 = 3;
        uVar3 = uStack_40;
        goto LAB_0011738a;
      }
LAB_001173b0:
      uStack_40 = 1;
    }
    else {
      if (count_00 != 0) goto LAB_001173b0;
      if (uVar3 == 2) {
        return 0xffffffffffffffff;
      }
      count_00 = (ulong)(ushort)(*(ushort *)(apdu + 5) << 8 | *(ushort *)(apdu + 5) >> 8);
      uStack_40 = 3;
    }
    uVar3 = uVar3 - uStack_40;
    if (uVar3 < count_00) {
      return 0xffffffffffffffff;
    }
    src = src + uStack_40;
  }
  if (cmd != (apdu_cmd_t *)0x0) {
    memCopy(cmd + 1,src,count_00);
  }
  uVar3 = uVar3 - count_00;
  switch(uVar3) {
  case 0:
    break;
  case 1:
    uVar3 = 0x100;
    if ((ulong)src[count_00] != 0) {
      uVar3 = (ulong)src[count_00];
    }
    if ((uint)uStack_40 == 3) {
      return 0xffffffffffffffff;
    }
    break;
  case 2:
    if ((uint)uStack_40 < 2) {
      return 0xffffffffffffffff;
    }
    uVar1 = *(ushort *)(src + count_00) << 8 | *(ushort *)(src + count_00) >> 8;
    uVar3 = 0x10000;
    if (uVar1 != 0) {
      uVar3 = (ulong)uVar1;
    }
    if (count_00 < 0x100) goto LAB_0011745e;
    break;
  case 3:
    uVar1 = *(ushort *)(src + count_00 + 1) << 8 | *(ushort *)(src + count_00 + 1) >> 8;
    uVar3 = 0x10000;
    if (uVar1 != 0) {
      uVar3 = (ulong)uVar1;
    }
    if (uStack_40 != 0) {
      return 0xffffffffffffffff;
    }
    if (src[count_00] != 0) {
      return 0xffffffffffffffff;
    }
LAB_0011745e:
    if ((uint)uVar3 < 0x101) {
      return 0xffffffffffffffff;
    }
    break;
  default:
    goto switchD_001173f1_default;
  }
  if (cmd != (apdu_cmd_t *)0x0) {
    cmd->cdf_len = count_00;
    cmd->rdf_len = uVar3;
  }
  sVar2 = count_00 + 0x18;
switchD_001173f1_default:
  return sVar2;
}

Assistant:

size_t apduCmdDec(apdu_cmd_t* cmd, const octet apdu[], size_t count)
{
	size_t cdf_len_len;
	size_t cdf_len;
	size_t rdf_len;
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(cmd, sizeof(apdu_cmd_t)));
	// декодировать заголовок
	if (count < 4)
		return SIZE_MAX;
	if (cmd)
	{
		ASSERT(memIsDisjoint2(cmd, sizeof(apdu_cmd_t), apdu, count));
		memSetZero(cmd, sizeof(apdu_cmd_t));
		cmd->cla = apdu[0], cmd->ins = apdu[1];
		cmd->p1 = apdu[2], cmd->p2 = apdu[3];
	}
	apdu += 4, count -= 4;
	// декодировать cdf_len
	if (count == 0 || count == 1 || count == 3 && apdu[0] == 0)
		cdf_len_len = 0, cdf_len = 0;
	else
	{
		ASSERT(count > 1);
		// короткая форма?
		if (apdu[0])
			cdf_len_len = 1, cdf_len = apdu[0];
		// длинная форма?
		else
		{
			if (count < 3)
				return SIZE_MAX;
			cdf_len_len = 3;
			cdf_len = apdu[1], cdf_len *= 256, cdf_len += apdu[2];
		}
		apdu += cdf_len_len, count -= cdf_len_len;
	}
	// декодировать cdf
	if (cdf_len > count)
		return SIZE_MAX;
	if (cmd)
		memCopy(cmd->cdf, apdu, cdf_len);
	apdu += cdf_len, count -= cdf_len;
	// декодировать rdf_len
	switch (count)
	{
	case 0:
		rdf_len = 0;
		break;
	case 1:
		// короткая форма
		rdf_len = apdu[0];
		if (rdf_len == 0)
			rdf_len = 256;
		if (cdf_len_len == 3)
			return SIZE_MAX;
		break;
	case 2:
		// длинная форма, 2 октета
		rdf_len = apdu[0], rdf_len *= 256, rdf_len += apdu[1];
		if (rdf_len == 0)
			rdf_len = 65536;
		if (cdf_len_len <= 1 || cdf_len < 256 && rdf_len <= 256)
			return SIZE_MAX;
		break;
	case 3:
		// длинная форма, 3 октета
		rdf_len = apdu[1], rdf_len *= 256, rdf_len += apdu[2];
		if (rdf_len == 0)
			rdf_len = 65536;
		if (apdu[0] != 0 || cdf_len_len != 0 || rdf_len <= 256)
			return SIZE_MAX;
		break;
	default:
		return SIZE_MAX;
	}
	// сохранить длины
	if (cmd)
		cmd->cdf_len = cdf_len, cmd->rdf_len = rdf_len;
	// возвратить размер cmd
	return sizeof(apdu_cmd_t) + cdf_len;
}